

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  Type TVar1;
  TestPartResultArray *this_00;
  pointer pcVar2;
  int iVar3;
  TestPartResult *pTVar4;
  AssertionResult *pAVar5;
  int index;
  char *pcVar6;
  Message msg;
  AssertionResult gtest_ar;
  string expected;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertionResult local_70;
  AssertionResult local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = this->results_;
  TVar1 = this->type_;
  pcVar6 = "1 non-fatal failure";
  if (TVar1 == kFatalFailure) {
    pcVar6 = "1 fatal failure";
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,pcVar6,pcVar6 + (ulong)(TVar1 != kFatalFailure) * 4 + 0xf);
  Message::Message((Message *)&local_78);
  if ((int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249 == 1) {
    pTVar4 = TestPartResultArray::GetTestPartResult(this_00,0);
    if (pTVar4->type_ == TVar1) {
      pcVar6 = strstr((pTVar4->message_)._M_dataplus._M_p,(this->substr_)._M_dataplus._M_p);
      if (pcVar6 != (char *)0x0) {
        local_60.success_ = true;
        local_60.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        goto LAB_00124d56;
      }
      local_70.success_ = false;
      local_70.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar5 = AssertionResult::operator<<(&local_70,(char (*) [11])0x147af5);
      pAVar5 = AssertionResult::operator<<(pAVar5,&local_50);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [14])" containing \"");
      pAVar5 = AssertionResult::operator<<(pAVar5,&this->substr_);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [3])0x1484c8);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [11])"  Actual:\n");
      pAVar5 = AssertionResult::operator<<(pAVar5,pTVar4);
      AssertionResult::AssertionResult(&local_60,pAVar5);
    }
    else {
      local_70.success_ = false;
      local_70.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar5 = AssertionResult::operator<<(&local_70,(char (*) [11])0x147af5);
      pAVar5 = AssertionResult::operator<<(pAVar5,&local_50);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [2])0x1481ab);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [11])"  Actual:\n");
      pAVar5 = AssertionResult::operator<<(pAVar5,pTVar4);
      AssertionResult::AssertionResult(&local_60,pAVar5);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78.ptr_ + 0x10),"Expected: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78.ptr_ + 0x10),local_50._M_dataplus._M_p,local_50._M_string_length
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_78.ptr_ + 0x10),"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78.ptr_ + 0x10),"  Actual: ",10);
    std::ostream::operator<<
              ((ostream *)(local_78.ptr_ + 0x10),
               (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78.ptr_ + 0x10)," failures",9);
    if (0 < (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249) {
      index = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_78.ptr_ + 0x10),"\n",1)
        ;
        pTVar4 = TestPartResultArray::GetTestPartResult(this_00,index);
        testing::operator<<((ostream *)(local_78.ptr_ + 0x10),pTVar4);
        index = index + 1;
        iVar3 = (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4);
      } while (SBORROW4(index,iVar3 * -0x49249249) != index + iVar3 * 0x49249249 < 0);
    }
    local_70.success_ = false;
    local_70.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar5 = AssertionResult::operator<<(&local_70,(Message *)&local_78);
    AssertionResult::AssertionResult(&local_60,pAVar5);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
LAB_00124d56:
  if (local_78.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_78.ptr_ + 8))();
    local_78.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_60.success_ == false) {
    Message::Message((Message *)&local_50);
    if (local_60.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_60.message_.ptr_)->_M_dataplus)._M_p;
    }
    AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rangolucas[P]algo2_taller1/tests/gtest-1.8.1/gtest-all.cc"
               ,0x887,pcVar6);
    AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_50);
    AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
      local_50._M_dataplus._M_p = (pointer)0x0;
    }
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  pcVar2 = (this->substr_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->substr_).field_2) {
    operator_delete(pcVar2);
  }
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}